

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

WriteNLResult * __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
          (WriteNLResult *__return_storage_ptr__,
          NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *this,
          string *namebase)

{
  WriteAuxFiles(this,namebase);
  WriteNL(this,namebase);
  std::
  pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(__return_storage_ptr__,&this->result_);
  return __return_storage_ptr__;
}

Assistant:

WriteNLResult NLWriter2<Params>::WriteFiles(
    const std::string& namebase) {
  WriteAuxFiles(namebase);
  WriteNL(namebase);
  return GetResult();
}